

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<iutest::TestEnv::RandomSeedSet,unsigned_int>
          (string *__return_storage_ptr__,internal *this,RandomSeedSet *value,uint *param_2)

{
  uint *param_1_local;
  RandomSeedSet *value_local;
  
  PrintToString<iutest::TestEnv::RandomSeedSet>(__return_storage_ptr__,(RandomSeedSet *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}